

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_03.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  int local_20;
  int sum;
  int number2;
  int number1;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _number2 = argv;
  argv_local._0_4_ = argc;
  std::operator<<((ostream *)&std::cout,"Enter first integer: ");
  std::istream::operator>>((istream *)&std::cin,&sum);
  std::operator<<((ostream *)&std::cout,"Enter second integer: ");
  std::istream::operator>>((istream *)&std::cin,&local_20);
  poVar1 = std::operator<<((ostream *)&std::cout,"Sum is ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,sum + local_20);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(int argc, const char *argv[]) {
    // variable declarations
    int number1;  // first integer to add
    int number2;  // second integer to add
    int sum;      // sum of number1 and number2

    std::cout << "Enter first integer: ";  // prompt user for data
    std::cin >> number1;  // read the first integer from user into number1

    std::cout << "Enter second integer: ";  // prompt user for data
    std::cin >> number2;  // read the second integer from user into number2

    sum = number1 + number2;

    std::cout << "Sum is " << sum << std::endl;

    return 0;
}